

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::(anonymous_namespace)::MicroStringPrevTest_AssignmentViaSetOwned_Test::
~MicroStringPrevTest_AssignmentViaSetOwned_Test
          (MicroStringPrevTest_AssignmentViaSetOwned_Test *this)

{
  internal::anon_unknown_0::MicroStringPrevTest_AssignmentViaSetOwned_Test::
  ~MicroStringPrevTest_AssignmentViaSetOwned_Test
            ((MicroStringPrevTest_AssignmentViaSetOwned_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, AssignmentViaSetOwned) {
  MicroString source = MakeFromState(kOwned, arena());

  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  const bool will_reuse = str_.Capacity() >= source.Get().size();
  str_.Set(source, arena());
  EXPECT_EQ(str_.Get(), source.Get());
  if (will_reuse) {
    ExpectMemoryUsed(used, false, self_used);
  } else {
    ExpectMemoryUsed(used, true, kLargeRepSize + str_.Get().size());
  }

  if (!has_arena()) source.Destroy();
}